

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

void __thiscall
gui::DialogBox::DialogBox(DialogBox *this,shared_ptr<gui::DialogBoxStyle> *style,String *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  Group::Group(&this->super_Group,name);
  (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase =
       (_func_int **)&PTR__DialogBox_001e6268;
  (this->super_Group).super_Container.super_Widget.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DialogBox_001e62f0;
  (this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (style->super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->styleCopied_ = false;
  (this->size_).x = 0.0;
  (this->size_).y = 0.0;
  this->draggable_ = true;
  (this->initialPosition_).x = 0.0;
  (this->initialPosition_).y = 0.0;
  (this->dragPoint_).first.x = 0.0;
  (this->dragPoint_).first.y = 0.0;
  (this->dragPoint_).second = false;
  (this->title_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->optionButtons_).
  super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons_).
  super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionButtons_).
  super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&this->submitIndex_ = 0xffffffff;
  *(undefined4 *)((long)&this->submitIndex_ + 4) = 0xffffffff;
  *(undefined4 *)&this->cancelIndex_ = 0xffffffff;
  *(undefined4 *)((long)&this->cancelIndex_ + 4) = 0xffffffff;
  this->titleAlignment_ = center;
  this->buttonAlignment_ = right;
  return;
}

Assistant:

DialogBox::DialogBox(std::shared_ptr<DialogBoxStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    draggable_(true),
    dragPoint_({0.0f, 0.0f}, false),
    submitIndex_(std::numeric_limits<size_t>::max()),
    cancelIndex_(std::numeric_limits<size_t>::max()),
    titleAlignment_(Alignment::center),
    buttonAlignment_(Alignment::right) {
}